

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led.c
# Opt level: O0

mraa_led_context mraa_led_init_internal(char *led)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  char *pcVar3;
  size_t sVar4;
  mraa_led_context dev;
  int cnt;
  dirent *entry;
  DIR *dir;
  size_t led_path_len;
  char *led_path;
  char *led_name;
  char brightness_path [64];
  char *led_local;
  
  led_path = (char *)0x0;
  dev._4_4_ = 0;
  brightness_path._56_8_ = led;
  led_local = (char *)calloc(1,0x20);
  if ((int *)led_local == (int *)0x0) {
    syslog(2,"led: init: Failed to allocate memory for context");
    led_local = (char *)0x0;
  }
  else {
    *(int *)((long)led_local + 0x10) = -1;
    *(int *)((long)led_local + 0x14) = -1;
    *(int *)((long)led_local + 0x18) = -1;
    __dirp = opendir("/sys/class/leds");
    if (__dirp != (DIR *)0x0) {
      while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
        pcVar3 = strstr(pdVar2->d_name,(char *)brightness_path._56_8_);
        if (pcVar3 != (char *)0x0) {
          led_path = pdVar2->d_name;
          break;
        }
        dev._4_4_ = dev._4_4_ + 1;
      }
    }
    *(int *)led_local = dev._4_4_;
    if (led_path == (char *)0x0) {
      syslog(2,"led: init: unknown device specified");
      if (__dirp != (DIR *)0x0) {
        closedir(__dirp);
      }
      free(led_local);
      led_local = (char *)0x0;
    }
    else {
      sVar4 = strlen(led_path);
      pcVar3 = (char *)calloc(sVar4 + 0x12,1);
      if (pcVar3 == (char *)0x0) {
        syslog(2,"led: init: Failed to allocate memory for LED path");
        closedir(__dirp);
        led_local = (char *)0x0;
      }
      else {
        snprintf(pcVar3,sVar4 + 0x12,"%s/%s","/sys/class/leds",led_path);
        *(char **)((long)led_local + 8) = pcVar3;
        snprintf((char *)&led_name,0x40,"%s/%s",pcVar3,"brightness");
        iVar1 = access((char *)&led_name,6);
        if (iVar1 != 0) {
          syslog(5,"led: init: current user doesn\'t have access rights for using LED %s",led_path);
        }
        closedir(__dirp);
      }
    }
  }
  return (mraa_led_context)led_local;
}

Assistant:

static mraa_led_context
mraa_led_init_internal(const char* led)
{
    char brightness_path[MAX_SIZE];
    const char *led_name = NULL;
    char *led_path;
    size_t led_path_len;
    DIR* dir;
    struct dirent* entry;
    int cnt = 0;

    mraa_led_context dev = (mraa_led_context) calloc(1, sizeof(struct _led));
    if (dev == NULL) {
        syslog(LOG_CRIT, "led: init: Failed to allocate memory for context");
        return NULL;
    }

    dev->trig_fd = -1;
    dev->bright_fd = -1;
    dev->max_bright_fd = -1;

    if ((dir = opendir(SYSFS_CLASS_LED)) != NULL) {
        /* get the led name from sysfs path */
        while ((entry = readdir(dir)) != NULL) {
            if (strstr((const char*) entry->d_name, led)) {
                led_name = entry->d_name;
                break;
            }
            cnt++;
        }
    }
    dev->count = cnt;
    if (led_name == NULL) {
        syslog(LOG_CRIT, "led: init: unknown device specified");
        if (dir != NULL) {
            closedir(dir);
        }
        free(dev);
        return NULL;
    }

    led_path_len = strlen(SYSFS_CLASS_LED) + strlen(led_name) + 3;
    led_path = calloc(led_path_len, sizeof(char));
    if (led_path == NULL) {
        syslog(LOG_CRIT, "led: init: Failed to allocate memory for LED path");
        closedir(dir);
        return NULL;
    }
    snprintf(led_path, led_path_len, "%s/%s", SYSFS_CLASS_LED, led_name);
    dev->led_path = led_path;

    snprintf(brightness_path, sizeof(brightness_path), "%s/%s", led_path, "brightness");
    if (access(brightness_path, R_OK | W_OK) != 0) {
        syslog(LOG_NOTICE, "led: init: current user doesn't have access rights for using LED %s", led_name);
    }

    closedir(dir);
    return dev;
}